

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

Abc_Cex_t * Ga2_ManDeriveCex(Ga2_Man_t *p,Vec_Int_t *vPis)

{
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar1;
  ulong uVar2;
  uint uVar3;
  Abc_Cex_t *pAVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  iVar7 = p->pGia->nRegs;
  pAVar4 = Abc_CexAlloc(iVar7,p->pGia->vCis->nSize - iVar7,p->pPars->iFrame + 1);
  pAVar4->iPo = 0;
  pAVar4->iFrame = p->pPars->iFrame;
  if (0 < vPis->nSize) {
    lVar6 = 0;
    do {
      iVar7 = vPis->pArray[lVar6];
      if (((long)iVar7 < 0) || (pGVar1 = p->pGia, pGVar1->nObjs <= iVar7)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar1->pObjs == (Gia_Obj_t *)0x0) {
        return pAVar4;
      }
      pObj = pGVar1->pObjs + iVar7;
      if ((((uint)*(undefined8 *)pObj & 0x9fffffff) == 0x9fffffff) &&
         (uVar3 = (uint)((ulong)*(undefined8 *)pObj >> 0x20),
         (int)(uVar3 & 0x1fffffff) < pGVar1->vCis->nSize - pGVar1->nRegs)) {
        if (pGVar1->vCis->nSize - pGVar1->nRegs <= (int)(uVar3 & 0x1fffffff)) {
          __assert_fail("Gia_ObjIsPi(p->pGia, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                        ,0x49a,"Abc_Cex_t *Ga2_ManDeriveCex(Ga2_Man_t *, Vec_Int_t *)");
        }
        if (-1 < pAVar4->iFrame) {
          iVar7 = -1;
          do {
            iVar7 = iVar7 + 1;
            uVar3 = Ga2_ObjFindLit(p,pObj,iVar7);
            uVar2 = *(ulong *)pObj;
            if ((~uVar2 & 0x1fffffff1fffffff) == 0) {
              __assert_fail("!Gia_ObjIsConst0(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                            ,0x487,"int Ga2_ObjSatValue(Ga2_Man_t *, Gia_Obj_t *, int)");
            }
            if (uVar3 != 0xffffffff) {
              if ((int)uVar3 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                              ,0x10c,"int Abc_Lit2Var(int)");
              }
              if (((int)(uVar3 >> 1) < p->pSat->size) &&
                 (((p->pSat->model[uVar3 >> 1] != 1 ^ (byte)uVar3) & 1) == 0)) {
                if (-1 < (int)uVar2) {
                  __assert_fail("pObj->fTerm",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                                ,0x1ac,"int Gia_ObjCioId(Gia_Obj_t *)");
                }
                iVar5 = ((uint)(uVar2 >> 0x20) & 0x1fffffff) + pAVar4->nRegs + pAVar4->nPis * iVar7;
                (&pAVar4[1].iPo)[iVar5 >> 5] =
                     (&pAVar4[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
              }
            }
          } while (iVar7 < pAVar4->iFrame);
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vPis->nSize);
  }
  return pAVar4;
}

Assistant:

Abc_Cex_t * Ga2_ManDeriveCex( Ga2_Man_t * p, Vec_Int_t * vPis )
{
    Abc_Cex_t * pCex;
    Gia_Obj_t * pObj;
    int i, f;
    pCex = Abc_CexAlloc( Gia_ManRegNum(p->pGia), Gia_ManPiNum(p->pGia), p->pPars->iFrame+1 );
    pCex->iPo = 0;
    pCex->iFrame = p->pPars->iFrame;
    Gia_ManForEachObjVec( vPis, p->pGia, pObj, i )
    {
        if ( !Gia_ObjIsPi(p->pGia, pObj) )
            continue;
        assert( Gia_ObjIsPi(p->pGia, pObj) );
        for ( f = 0; f <= pCex->iFrame; f++ )
            if ( Ga2_ObjSatValue( p, pObj, f ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + Gia_ObjCioId(pObj) );
    }
    return pCex;
}